

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O1

mod2sparse * mod2sparse_allocate(int n_rows,int n_cols)

{
  mod2sparse *pmVar1;
  mod2entry *pmVar2;
  mod2entry *pmVar3;
  mod2sparse *extraout_RAX;
  ulong uVar4;
  ulong uVar5;
  undefined4 in_register_0000003c;
  long lVar6;
  undefined8 *__ptr;
  
  lVar6 = CONCAT44(in_register_0000003c,n_rows);
  if ((0 < n_rows) && (uVar4 = (ulong)(uint)n_cols, 0 < n_cols)) {
    pmVar1 = (mod2sparse *)chk_alloc(1,0x28);
    pmVar1->n_rows = n_rows;
    pmVar1->n_cols = n_cols;
    pmVar2 = (mod2entry *)chk_alloc(n_rows,0x38);
    pmVar1->rows = pmVar2;
    pmVar3 = (mod2entry *)chk_alloc(n_cols,0x38);
    pmVar1->cols = pmVar3;
    pmVar1->blocks = (mod2block *)0x0;
    pmVar1->next_free = (mod2entry *)0x0;
    pmVar2 = pmVar1->rows;
    uVar5 = (ulong)(uint)n_rows;
    do {
      pmVar2->down = pmVar2;
      pmVar2->up = pmVar2;
      pmVar2->right = pmVar2;
      pmVar2->left = pmVar2;
      pmVar2->row = -1;
      pmVar2->col = -1;
      pmVar2 = pmVar2 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    if (0 < n_cols) {
      do {
        pmVar3->down = pmVar3;
        pmVar3->up = pmVar3;
        pmVar3->right = pmVar3;
        pmVar3->left = pmVar3;
        pmVar3->row = -1;
        pmVar3->col = -1;
        pmVar3 = pmVar3 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    return pmVar1;
  }
  mod2sparse_allocate_cold_1();
  free(*(void **)(lVar6 + 8));
  __ptr = *(undefined8 **)(lVar6 + 0x10);
  while( true ) {
    free(__ptr);
    __ptr = *(undefined8 **)(lVar6 + 0x18);
    if (__ptr == (undefined8 *)0x0) break;
    *(undefined8 *)(lVar6 + 0x18) = *__ptr;
  }
  return extraout_RAX;
}

Assistant:

mod2sparse *mod2sparse_allocate
( int n_rows, 		/* Number of rows in matrix */
  int n_cols		/* Number of columns in matrix */
)
{
  mod2sparse *m;
  mod2entry *e;
  int i, j;

  if (n_rows<=0 || n_cols<=0)
  { fprintf(stderr,"mod2sparse_allocate: Invalid number of rows or columns\n");
    exit(1);
  }

  m = chk_alloc (1, sizeof *m);

  m->n_rows = n_rows;
  m->n_cols = n_cols;

  m->rows = chk_alloc (n_rows, sizeof *m->rows);
  m->cols = chk_alloc (n_cols, sizeof *m->cols);

  m->blocks = 0;
  m->next_free = 0;

  for (i = 0; i<n_rows; i++)
  { e = &m->rows[i];
    e->left = e->right = e->up = e->down = e;
    e->row = e->col = -1;
  }

  for (j = 0; j<n_cols; j++)
  { e = &m->cols[j];
    e->left = e->right = e->up = e->down = e;
    e->row = e->col = -1;
  }

  return m;
}